

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void IssueReadRequests(SstStream Stream,FFSArrayRequest_conflict Reqs)

{
  long lVar1;
  size_t __size;
  int iVar2;
  void *pvVar3;
  FFSArrayRequest_conflict in_RSI;
  long in_RDI;
  undefined1 auVar4 [16];
  char tmpstr [256];
  void *DP_TimestepInfo;
  size_t DataSize;
  int WriterRank;
  int i;
  SstFullMetadata Mdata;
  FFSReaderMarshalBase *Info;
  char local_138 [8];
  void *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  SstStream in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff10;
  uint local_28;
  int local_24;
  FFSArrayRequest_conflict local_10;
  
  lVar1 = *(long *)(in_RDI + 0x300);
  for (local_10 = in_RSI; local_10 != (FFSArrayRequest_conflict)0x0; local_10 = local_10->Next) {
    for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x238); local_24 = local_24 + 1) {
      if ((*(int *)(*(long *)(lVar1 + 0x40) + (long)local_24 * 0x18) != 1) &&
         (iVar2 = NeedWriter(local_10,local_24), iVar2 != 0)) {
        *(undefined4 *)(*(long *)(lVar1 + 0x40) + (long)local_24 * 0x18) = 1;
      }
    }
  }
  for (local_28 = 0; (int)local_28 < *(int *)(in_RDI + 0x238); local_28 = local_28 + 1) {
    if (*(int *)(*(long *)(lVar1 + 0x40) + (long)(int)local_28 * 0x18) == 1) {
      __size = *(size_t *)(*(long *)(*(long *)(lVar1 + 0x20) + (long)(int)local_28 * 8) + 0x10);
      pvVar3 = realloc(*(void **)(*(long *)(lVar1 + 0x40) + (long)(int)local_28 * 0x18 + 8),__size);
      *(void **)(*(long *)(lVar1 + 0x40) + (long)(int)local_28 * 0x18 + 8) = pvVar3;
      memset(local_138,0,0x100);
      snprintf(local_138,0x100,"Request to rank %d, bytes",(ulong)local_28);
      if (_perfstubs_initialized == 1) {
        if (IssueReadRequests::__var842 == (void *)0x0) {
          IssueReadRequests::__var842 = (void *)ps_create_counter_(local_138);
        }
        auVar4._8_4_ = (int)(__size >> 0x20);
        auVar4._0_8_ = __size;
        auVar4._12_4_ = 0x45300000;
        ps_sample_counter_((auVar4._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)__size) - 4503599627370496.0),
                           IssueReadRequests::__var842);
      }
      pvVar3 = SstReadRemoteMemory(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                                   in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                   in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                   in_stack_ffffffffffffff10);
      *(void **)(*(long *)(lVar1 + 0x40) + (long)(int)local_28 * 0x18 + 0x10) = pvVar3;
      *(undefined4 *)(*(long *)(lVar1 + 0x40) + (long)(int)local_28 * 0x18) = 2;
    }
  }
  return;
}

Assistant:

static void IssueReadRequests(SstStream Stream, FFSArrayRequest Reqs)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    SstFullMetadata Mdata = Stream->CurrentMetadata;

    while (Reqs)
    {
        int i;
        for (i = 0; i < Stream->WriterCohortSize; i++)
        {
            if ((Info->WriterInfo[i].Status != Needed) && (NeedWriter(Reqs, i)))
            {
                Info->WriterInfo[i].Status = Needed;
            }
        }
        Reqs = Reqs->Next;
    }

    for (int WriterRank = 0; WriterRank < Stream->WriterCohortSize; WriterRank++)
    {
        if (Info->WriterInfo[WriterRank].Status == Needed)
        {
            size_t DataSize = ((struct FFSMetadataInfoStruct *)Info->MetadataBaseAddrs[WriterRank])
                                  ->DataBlockSize;
            void *DP_TimestepInfo =
                Mdata->DP_TimestepInfo ? Mdata->DP_TimestepInfo[WriterRank] : NULL;
            Info->WriterInfo[WriterRank].RawBuffer =
                realloc(Info->WriterInfo[WriterRank].RawBuffer, DataSize);

            char tmpstr[256] = {0};
            snprintf(tmpstr, sizeof(tmpstr), "Request to rank %d, bytes", WriterRank);
            PERFSTUBS_SAMPLE_COUNTER(tmpstr, (double)DataSize);
            Info->WriterInfo[WriterRank].ReadHandle =
                SstReadRemoteMemory(Stream, WriterRank, Stream->ReaderTimestep, 0, DataSize,
                                    Info->WriterInfo[WriterRank].RawBuffer, DP_TimestepInfo);
            Info->WriterInfo[WriterRank].Status = Requested;
        }
    }
}